

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cc
# Opt level: O1

string * __thiscall flow::Signature::to_s_abi_cxx11_(string *__return_storage_ptr__,Signature *this)

{
  pointer pcVar1;
  LiteralType *pLVar2;
  LiteralType *pLVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->name_)._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pLVar2 = (this->args_).super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pLVar3 = (this->args_).
                super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
                super__Vector_impl_data._M_start; pLVar3 != pLVar2; pLVar3 = pLVar3 + 1) {
    signatureType(*pLVar3);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  signatureType(this->returnType_);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Signature::to_s() const {
  std::string result = name_;
  result += "(";
  for (LiteralType t : args_) result += signatureType(t);
  result += ")";
  result += signatureType(returnType_);
  return result;
}